

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void address_space_update_topology_pass
               (AddressSpace *as,FlatView *old_view,FlatView *new_view,_Bool adding)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  _Bool _Var1;
  FlatView *pFVar2;
  bool bVar3;
  undefined8 in_stack_fffffffffffffe68;
  FlatRange *in_stack_fffffffffffffe70;
  FlatRange *in_stack_fffffffffffffe78;
  FlatRange *in_stack_fffffffffffffe80;
  MemoryListener *local_170;
  MemoryListener *_listener_2;
  MemoryRegionSection mrs_2;
  MemoryListener *local_120;
  MemoryListener *_listener_1;
  MemoryRegionSection mrs_1;
  void *local_d0;
  MemoryListener *_listener;
  MemoryRegionSection mrs;
  FlatRange *local_40;
  FlatRange *frnew;
  FlatRange *frold;
  uint local_28;
  uint inew;
  uint iold;
  _Bool adding_local;
  FlatView *new_view_local;
  FlatView *old_view_local;
  AddressSpace *as_local;
  
  frold._4_4_ = 0;
  local_28 = 0;
  do {
    while( true ) {
      bVar3 = true;
      if (old_view->nr <= local_28) {
        bVar3 = frold._4_4_ < new_view->nr;
      }
      if (!bVar3) {
        return;
      }
      if (local_28 < old_view->nr) {
        frnew = old_view->ranges + local_28;
      }
      else {
        frnew = (FlatRange *)0x0;
      }
      if (frold._4_4_ < new_view->nr) {
        local_40 = new_view->ranges + frold._4_4_;
      }
      else {
        local_40 = (FlatRange *)0x0;
      }
      if (frnew != (FlatRange *)0x0) break;
LAB_012b2e2c:
      if (((frnew == (FlatRange *)0x0) || (local_40 == (FlatRange *)0x0)) ||
         (_Var1 = flatrange_equal(frnew,local_40), !_Var1)) {
        if (adding) {
          pFVar2 = address_space_to_flatview(as);
          section_from_flat_range((MemoryRegionSection *)&_listener_2,local_40,pFVar2);
          for (local_170 = (as->listeners).tqh_first; in_stack_fffffffffffffe70 = local_40,
              local_170 != (MemoryListener *)0x0; local_170 = (local_170->link_as).tqe_next) {
            if (local_170->region_add !=
                (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
              (*local_170->region_add)(local_170,(MemoryRegionSection *)&_listener_2);
            }
          }
        }
      }
      else {
        if (adding) {
          pFVar2 = address_space_to_flatview(as);
          section_from_flat_range((MemoryRegionSection *)&_listener_1,local_40,pFVar2);
          for (local_120 = (as->listeners).tqh_first; in_stack_fffffffffffffe78 = local_40,
              local_120 != (MemoryListener *)0x0; local_120 = (local_120->link_as).tqe_next) {
            if (local_120->region_nop !=
                (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
              (*local_120->region_nop)(local_120,(MemoryRegionSection *)&_listener_1);
            }
          }
        }
        local_28 = local_28 + 1;
      }
      frold._4_4_ = frold._4_4_ + 1;
    }
    if ((local_40 != (FlatRange *)0x0) &&
       (a._8_8_ = in_stack_fffffffffffffe70, a._0_8_ = in_stack_fffffffffffffe68,
       b._8_8_ = in_stack_fffffffffffffe80, b._0_8_ = in_stack_fffffffffffffe78,
       _Var1 = int128_lt((Int128)a,(Int128)b), !_Var1)) {
      mrs._56_8_ = *(undefined8 *)&(local_40->addr).start;
      a_00._8_8_ = in_stack_fffffffffffffe70;
      a_00._0_8_ = in_stack_fffffffffffffe68;
      b_00._8_8_ = in_stack_fffffffffffffe80;
      b_00._0_8_ = in_stack_fffffffffffffe78;
      _Var1 = int128_eq((Int128)a_00,(Int128)b_00);
      if ((!_Var1) || (_Var1 = flatrange_equal(frnew,local_40), _Var1)) goto LAB_012b2e2c;
    }
    if (!adding) {
      pFVar2 = address_space_to_flatview(as);
      section_from_flat_range((MemoryRegionSection *)&_listener,frnew,pFVar2);
      for (local_d0 = ((as->listeners).tqh_circ.tql_prev)->tql_prev->tql_next;
          in_stack_fffffffffffffe80 = frnew, local_d0 != (void *)0x0;
          local_d0 = (void *)**(undefined8 **)(*(long *)((long)local_d0 + 0x48) + 8)) {
        if (*(long *)((long)local_d0 + 0x18) != 0) {
          (**(code **)((long)local_d0 + 0x18))(local_d0,&_listener);
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static void address_space_update_topology_pass(AddressSpace *as,
                                               const FlatView *old_view,
                                               const FlatView *new_view,
                                               bool adding)
{
    unsigned iold, inew;
    FlatRange *frold, *frnew;

    /* Generate a symmetric difference of the old and new memory maps.
     * Kill ranges in the old map, and instantiate ranges in the new map.
     */
    iold = inew = 0;
    while (iold < old_view->nr || inew < new_view->nr) {
        if (iold < old_view->nr) {
            frold = &old_view->ranges[iold];
        } else {
            frold = NULL;
        }
        if (inew < new_view->nr) {
            frnew = &new_view->ranges[inew];
        } else {
            frnew = NULL;
        }

        if (frold
            && (!frnew
                || int128_lt(frold->addr.start, frnew->addr.start)
                || (int128_eq(frold->addr.start, frnew->addr.start)
                    && !flatrange_equal(frold, frnew)))) {
            /* In old but not in new, or in both but attributes changed. */

            if (!adding) {
                MEMORY_LISTENER_UPDATE_REGION(frold, as, Reverse, region_del);
            }

            ++iold;
        } else if (frold && frnew && flatrange_equal(frold, frnew)) {
            /* In both and unchanged (except logging may have changed) */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_nop);
            }

            ++iold;
            ++inew;
        } else {
            /* In new */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_add);
            }

            ++inew;
        }
    }
}